

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Sound.cpp
# Opt level: O0

void __thiscall
XPMP2::SoundFile::SoundFile
          (SoundFile *this,SoundSystem *_pSndSys,string *_filePath,bool _bLoop,float _coneDir,
          float _conePitch,float _coneInAngle,float _coneOutAngle,float _coneOutVol)

{
  byte in_CL;
  string *in_RDX;
  undefined8 in_RSI;
  undefined8 *in_RDI;
  undefined4 in_XMM0_Da;
  undefined4 in_XMM1_Da;
  undefined4 in_XMM2_Da;
  undefined4 in_XMM3_Da;
  undefined4 in_XMM4_Da;
  
  *in_RDI = &PTR__SoundFile_0046e878;
  in_RDI[1] = in_RSI;
  std::__cxx11::string::string((string *)(in_RDI + 2),in_RDX);
  *(byte *)(in_RDI + 6) = in_CL & 1;
  *(undefined4 *)((long)in_RDI + 0x34) = in_XMM0_Da;
  *(undefined4 *)(in_RDI + 7) = in_XMM1_Da;
  *(undefined4 *)((long)in_RDI + 0x3c) = in_XMM2_Da;
  *(undefined4 *)(in_RDI + 8) = in_XMM3_Da;
  *(undefined4 *)((long)in_RDI + 0x44) = in_XMM4_Da;
  return;
}

Assistant:

SoundFile::SoundFile (SoundSystem* _pSndSys,
                      const std::string& _filePath, bool _bLoop,
                      float _coneDir, float _conePitch,
                      float _coneInAngle, float _coneOutAngle, float _coneOutVol) :
    pSndSys(_pSndSys), filePath(_filePath), bLoop(_bLoop),
    coneDir(_coneDir), conePitch(_conePitch),
    coneInAngle(_coneInAngle), coneOutAngle(_coneOutAngle), coneOutVol(_coneOutVol)
{}